

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O3

void generate<trng::lcg64>(size_t samples,unsigned_long seed)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  parameter_type P;
  lcg64 r;
  char local_39;
  lcg64 local_38;
  
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64::lcg64(&local_38,P);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# generator ",0xc);
  __s = trng::lcg64::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3500d0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  seed = ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"type: d\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"count: ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"numbit: ",8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_39,1);
  if (samples != 0) {
    do {
      local_38.S.r = local_38.S.r * local_38.P.a + local_38.P.b;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_39 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_39,1);
      samples = samples - 1;
    } while (samples != 0);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}